

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O1

void blake2b_long(void *out,size_t outlen,void *in,size_t inlen)

{
  undefined8 *__dest;
  uint uVar1;
  int iVar2;
  ulong outlen_00;
  uint8_t out_buffer [64];
  blake2b_state blake_state;
  int local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  blake2b_state local_108;
  
  iVar2 = (int)outlen;
  local_14c = iVar2;
  if (outlen < 0x41) {
    local_108.h[1] = 0xbb67ae8584caa73b;
    local_108.h[6] = 0x1f83d9abfb41bd6b;
    local_108.h[7] = 0x5be0cd19137e2179;
    local_108.h[4] = 0x510e527fade682d1;
    local_108.h[5] = 0x9b05688c2b3e6c1f;
    local_108.h[2] = 0x3c6ef372fe94f82b;
    local_108.h[3] = 0xa54ff53a5f1d36f1;
    local_108.buflen = 0;
    local_108.t[0] = 0;
    local_108.t[1] = 0;
    local_108.h[0] = (outlen | 0x1010000) ^ 0x6a09e667f3bcc908;
    blake2b_update(&local_108,&local_14c,4);
    blake2b_update(&local_108,in,inlen);
    blake2b_final(&local_108,out,outlen);
  }
  else {
    local_108.h[1] = 0xbb67ae8584caa73b;
    local_108.h[2] = 0x3c6ef372fe94f82b;
    local_108.h[3] = 0xa54ff53a5f1d36f1;
    local_108.h[4] = 0x510e527fade682d1;
    local_108.h[5] = 0x9b05688c2b3e6c1f;
    local_108.h[6] = 0x1f83d9abfb41bd6b;
    local_108.h[7] = 0x5be0cd19137e2179;
    local_108.buflen = 0;
    local_108.t[0] = 0;
    local_108.t[1] = 0;
    local_108.h[0] = 0x6a09e667f2bdc948;
    blake2b_update(&local_108,&local_14c,4);
    blake2b_update(&local_108,in,inlen);
    blake2b_final(&local_108,&local_148,0x40);
    *(undefined8 *)((long)out + 0x10) = local_138;
    *(undefined8 *)((long)out + 0x18) = uStack_130;
    *(undefined8 *)out = local_148;
    *(undefined8 *)((long)out + 8) = uStack_140;
    uVar1 = iVar2 - 0x20;
    __dest = (undefined8 *)((long)out + 0x20);
    if (0x40 < uVar1) {
      do {
        local_108.h[6] = 0x1f83d9abfb41bd6b;
        local_108.h[7] = 0x5be0cd19137e2179;
        local_108.h[4] = 0x510e527fade682d1;
        local_108.h[5] = 0x9b05688c2b3e6c1f;
        local_108.h[2] = 0x3c6ef372fe94f82b;
        local_108.h[3] = 0xa54ff53a5f1d36f1;
        local_108.h[1] = 0xbb67ae8584caa73b;
        local_108.buflen = 0;
        local_108.t[0] = 0;
        local_108.t[1] = 0;
        local_108.h[0] = 0x6a09e667f2bdc948;
        blake2b_update(&local_108,&local_148,0x40);
        blake2b_final(&local_108,&local_148,0x40);
        __dest[2] = local_138;
        __dest[3] = uStack_130;
        *__dest = local_148;
        __dest[1] = uStack_140;
        uVar1 = uVar1 - 0x20;
        __dest = __dest + 4;
      } while (0x40 < uVar1);
    }
    outlen_00 = (ulong)uVar1;
    local_108.h[6] = 0x1f83d9abfb41bd6b;
    local_108.h[7] = 0x5be0cd19137e2179;
    local_108.h[4] = 0x510e527fade682d1;
    local_108.h[5] = 0x9b05688c2b3e6c1f;
    local_108.h[2] = 0x3c6ef372fe94f82b;
    local_108.h[3] = 0xa54ff53a5f1d36f1;
    local_108.h[1] = 0xbb67ae8584caa73b;
    local_108.buflen = 0;
    local_108.t[0] = 0;
    local_108.t[1] = 0;
    local_108.h[0] = (outlen_00 | 0x1010000) ^ 0x6a09e667f3bcc908;
    blake2b_update(&local_108,&local_148,0x40);
    blake2b_final(&local_108,&local_148,outlen_00);
    memcpy(__dest,&local_148,outlen_00);
    clear_internal_memory(&local_148,0x40);
  }
  return;
}

Assistant:

void blake2b_long(void *out, size_t outlen, const void *in, size_t inlen)
{
    uint8_t *pout = (uint8_t *)out;
    blake2b_state blake_state;
    uint8_t outlen_bytes[sizeof(uint32_t)] = {0};

    store32(outlen_bytes, (uint32_t)outlen);
    if (outlen <= BLAKE2B_OUTBYTES) {
        blake2b_init(&blake_state, outlen);
        blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes));
        blake2b_update(&blake_state, in, inlen);
        blake2b_final(&blake_state, pout, outlen);
    } else {
        uint32_t toproduce;
        uint8_t out_buffer[BLAKE2B_OUTBYTES];

        blake2b_init(&blake_state, BLAKE2B_OUTBYTES);
        blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes));
        blake2b_update(&blake_state, in, inlen);
        blake2b_final(&blake_state, out_buffer, BLAKE2B_OUTBYTES);

        memcpy(pout, out_buffer, BLAKE2B_OUTBYTES / 2);
        pout += BLAKE2B_OUTBYTES / 2;
        toproduce = (uint32_t)outlen - BLAKE2B_OUTBYTES / 2;

        while (toproduce > BLAKE2B_OUTBYTES) {
            blake2b_init(&blake_state, BLAKE2B_OUTBYTES);
            blake2b_update(&blake_state, out_buffer, BLAKE2B_OUTBYTES);
            blake2b_final(&blake_state, out_buffer, BLAKE2B_OUTBYTES);

            memcpy(pout, out_buffer, BLAKE2B_OUTBYTES / 2);
            pout += BLAKE2B_OUTBYTES / 2;
            toproduce -= BLAKE2B_OUTBYTES / 2;
        }

        blake2b_init(&blake_state, toproduce);
        blake2b_update(&blake_state, out_buffer, BLAKE2B_OUTBYTES);
        blake2b_final(&blake_state, out_buffer, toproduce);

        memcpy(pout, out_buffer, toproduce);

        clear_internal_memory(out_buffer, sizeof(out_buffer));
    }
}